

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBest
          (TaggerImpl *this,size_t N,char *str,size_t len,char *out,size_t len2)

{
  char *pcVar1;
  int iVar2;
  Lattice *pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var4;
  
  pLVar3 = mutable_lattice(this);
  (*pLVar3->_vptr_Lattice[10])(pLVar3,str,len);
  initRequestType(this);
  (*pLVar3->_vptr_Lattice[0x14])(pLVar3,2);
  iVar2 = (**(this->super_Tagger)._vptr_Tagger)(this);
  pp_Var4 = pLVar3->_vptr_Lattice;
  if ((char)iVar2 != '\0') {
    iVar2 = (*pp_Var4[0x1d])(pLVar3,N,out,len2);
    if ((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) {
      return (char *)CONCAT44(extraout_var,iVar2);
    }
    pp_Var4 = pLVar3->_vptr_Lattice;
  }
  iVar2 = (*pp_Var4[0x24])(pLVar3);
  pcVar1 = (char *)(this->what_)._M_string_length;
  strlen((char *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::string::_M_replace((ulong)&this->what_,0,pcVar1,CONCAT44(extraout_var_00,iVar2));
  return (char *)0x0;
}

Assistant:

const char* TaggerImpl::parseNBest(size_t N, const char* str, size_t len,
                                   char *out, size_t len2) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);

  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }

  const char *result = lattice->enumNBestAsString(N, out, len2);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}